

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmaster.c
# Opt level: O1

ebml_element *
EBML_MasterFindNextElt
          (ebml_master *Element,ebml_element *Current,bool_t bCreateIfNull,bool_t SetDefault,
          int ForProfile)

{
  ebml_element *peVar1;
  ebml_element *peVar2;
  char *__assertion;
  bool bVar3;
  
  if (Current == (ebml_element *)0x0) {
    return (ebml_element *)0x0;
  }
  peVar2 = (ebml_element *)(Current->Base).Next;
  if (peVar2 == Current) {
    __assertion = "(nodetree*)(Current) != ((nodetree*)(Current))->Next";
  }
  else {
    do {
      if ((peVar2 == (ebml_element *)0x0) || (peVar2->Context->Id == Current->Context->Id)) {
        if (bCreateIfNull == 0 || peVar2 != (ebml_element *)0x0) {
          return peVar2;
        }
        peVar2 = EBML_MasterAddElt(Element,Current->Context,SetDefault,ForProfile);
        return peVar2;
      }
      peVar1 = (ebml_element *)(peVar2->Base).Next;
      bVar3 = peVar2 != peVar1;
      peVar2 = peVar1;
    } while (bVar3);
    __assertion = "(nodetree*)(i) != ((nodetree*)(i))->Next";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                ,0x48,
                "ebml_element *EBML_MasterFindNextElt(ebml_master *, const ebml_element *, bool_t, bool_t, int)"
               );
}

Assistant:

ebml_element *EBML_MasterFindNextElt(ebml_master *Element, const ebml_element *Current, bool_t bCreateIfNull, bool_t SetDefault, int ForProfile)
{
    ebml_element *i;
    if (!Current)
        return NULL;

    for (i=EBML_MasterNext(Current);i;i=EBML_MasterNext(i))
    {
        if (i->Context->Id == Current->Context->Id)
            break;
    }

    if (!i && bCreateIfNull)
        i = EBML_MasterAddElt(Element,Current->Context,SetDefault, ForProfile);

    return i;
}